

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_6.cpp
# Opt level: O1

int main(void)

{
  string sentence;
  long *local_30;
  long local_20 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter a sentence terminated by dot and press enter. ",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\nThere must be a space character after last word in sentence and dot.\n",0x46);
  readSentence_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return 0;
}

Assistant:

int main()
{
	std::cout << "Enter a sentence terminated by dot and press enter. "
			  << "\nThere must be a space character after last word in sentence and dot.\n";

	try
	{
		auto sentence = readSentence();
		std::cout << "OK" << std::endl;
	}
	catch (std::runtime_error& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}